

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode JsGetIndexedProperty(JsValueRef object,JsValueRef index,JsValueRef *result)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  BOOL BVar2;
  JsrtContext *pJVar3;
  RecyclableObject *pRVar4;
  Var pvVar5;
  JsErrorCode exitStatus;
  void *unaff_retaddr;
  undefined1 auStack_a8 [8];
  ScriptEntryExitRecord __entryExitRecord;
  EnterScriptObject __enterScriptObject;
  TTDRecorder _actionEntryPopper;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  __enterScriptObject.library = (JavascriptLibrary *)0x0;
  _actionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  pJVar3 = JsrtContext::GetCurrent();
  if (pJVar3 == (JsrtContext *)0x0) {
    exitStatus = JsErrorNoCurrentContext;
    goto LAB_0036c9e3;
  }
  scriptContext = (((pJVar3->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
  ;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&_actionEntryPopper.m_resultPtr + 4),
             ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
  __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
  __entryExitRecord.scriptContext = (ScriptContext *)0x0;
  __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
  __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
  __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
  auStack_a8 = (undefined1  [8])0x0;
  __entryExitRecord._0_1_ = 0;
  __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
  __entryExitRecord._2_6_ = 0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType,scriptContext,
             (ScriptEntryExitRecord *)auStack_a8,unaff_retaddr,&stack0x00000000,true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    TTD::EventLog::RecordJsRTGetIndex
              (scriptContext->threadContext->TTDLog,
               (TTDJsRTActionResultAutoRecorder *)&__enterScriptObject.library,index,object);
  }
  exitStatus = JsErrorInvalidArgument;
  if (object != (JsValueRef)0x0) {
    BVar2 = Js::JavascriptOperators::IsObject(object);
    if (BVar2 == 0) {
      exitStatus = JsErrorArgumentNotObject;
    }
    else {
      pRVar4 = Js::VarTo<Js::RecyclableObject>(object);
      pSVar1 = (((((pRVar4->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        exitStatus = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_0036c9d1;
        object = Js::CrossSite::MarshalVar(scriptContext,pRVar4,false);
      }
      exitStatus = JsErrorInvalidArgument;
      if (index != (JsValueRef)0x0) {
        if ((ulong)index >> 0x30 == 0) {
          pRVar4 = Js::VarTo<Js::RecyclableObject>(index);
          pSVar1 = (((((pRVar4->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                   scriptContext.ptr;
          if (pSVar1 != scriptContext) {
            exitStatus = JsErrorWrongRuntime;
            if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_0036c9d1;
            index = Js::CrossSite::MarshalVar(scriptContext,pRVar4,false);
          }
        }
        if (result == (JsValueRef *)0x0) {
          exitStatus = JsErrorNullArgument;
        }
        else {
          *result = (JsValueRef)0x0;
          pvVar5 = Js::JavascriptOperators::OP_GetElementI(object,index,scriptContext);
          *result = pvVar5;
          exitStatus = JsNoError;
          if (scriptContext->TTDShouldPerformRecordAction == true) {
            TTD::TTDJsRTActionResultAutoRecorder::SetResult
                      ((TTDJsRTActionResultAutoRecorder *)&__enterScriptObject.library,result);
            exitStatus = JsNoError;
          }
        }
      }
    }
  }
LAB_0036c9d1:
  Js::EnterScriptObject::~EnterScriptObject
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&_actionEntryPopper.m_resultPtr + 4));
LAB_0036c9e3:
  TTD::TTDJsRTActionResultAutoRecorder::CompleteWithStatusCode
            ((TTDJsRTActionResultAutoRecorder *)&__enterScriptObject.library,exitStatus);
  return exitStatus;
}

Assistant:

CHAKRA_API JsGetIndexedProperty(_In_ JsValueRef object, _In_ JsValueRef index, _Out_ JsValueRef *result)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&] (Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTGetIndex, index, object);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_REFERENCE(index, scriptContext);
        PARAM_NOT_NULL(result);
        *result = nullptr;

        *result = (JsValueRef)Js::JavascriptOperators::OP_GetElementI((Js::Var)object, (Js::Var)index, scriptContext);

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, result);

        return JsNoError;
    });
}